

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator-debug.c
# Opt level: O1

int emulator_add_empty_breakpoint(void)

{
  byte bVar1;
  int iVar2;
  ulong in_RAX;
  int iVar3;
  int iVar4;
  ulong uVar5;
  
  uVar5 = 0;
  iVar3 = s_breakpoint_max_id;
  iVar4 = s_breakpoint_count;
  while( true ) {
    bVar1 = s_breakpoints[uVar5].field_0x7;
    if ((bVar1 & 1) == 0) {
      s_breakpoints[uVar5].id = (int)uVar5;
      s_breakpoints[uVar5].bank = '\0';
      s_breakpoints[uVar5].addr = 0;
      s_breakpoints[uVar5].field_0x7 = (bVar1 & 0xfc) + 1;
      iVar2 = (int)uVar5 + 1;
      if (iVar3 < iVar2) {
        iVar3 = iVar2;
      }
      iVar4 = iVar4 + 1;
      in_RAX = uVar5 & 0xffffffff;
      s_breakpoint_max_id = iVar3;
      s_breakpoint_count = iVar4;
    }
    if ((bVar1 & 1) == 0) break;
    uVar5 = uVar5 + 1;
    if (uVar5 == 0x100) {
      return -1;
    }
  }
  return (int)in_RAX;
}

Assistant:

int emulator_add_empty_breakpoint(void) {
  int id;
  for (id = 0; id < MAX_BREAKPOINTS; ++id) {
    Breakpoint* bp = &s_breakpoints[id];
    if (!bp->valid) {
      bp->id = id;
      bp->addr = bp->bank = 0;
      bp->enabled = FALSE;
      bp->valid = TRUE;
      s_breakpoint_max_id = MAX(id + 1, s_breakpoint_max_id);
      ++s_breakpoint_count;
      return id;
    }
  }
  return -1;
}